

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse_Digits_OnePass(int i)

{
  int i_local;
  
  Parse3Digits(i,Parse3OnePass);
  return;
}

Assistant:

void Parse_Digits_OnePass(int i)     { Parse3Digits(i, Parse3OnePass); }